

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PQ.h
# Opt level: O1

void __thiscall
ProductQuantization<float,_KBalls<float>_>::productJoinClusters
          (ProductQuantization<float,_KBalls<float>_> *this)

{
  pointer pKVar1;
  undefined8 uVar2;
  pointer pCVar3;
  long lVar4;
  ulong uVar5;
  function<void_(int,_const_Cluster<float>_&)> mergeRecursive;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  anon_class_16_2_9c50e7d5 local_38;
  
  local_38.mergeRecursive = (function<void_(int,_const_Cluster<float>_&)> *)&local_58;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_38.this = this;
  std::function<void(int,Cluster<float>const&)>::operator=
            ((function<void(int,Cluster<float>const&)> *)local_58._M_pod_data,&local_38);
  pKVar1 = (this->kMeans_).super__Vector_base<KBalls<float>,_std::allocator<KBalls<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (pKVar1->super_StandardKMeans<float>).super_AbstractKMeans<float>.clusters_.
           super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pKVar1->super_StandardKMeans<float>).super_AbstractKMeans<float>.clusters_ + 8) !=
      pCVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_38.this = (ProductQuantization<float,_KBalls<float>_> *)CONCAT44(local_38.this._4_4_,1);
      if (local_48 == (code *)0x0) {
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*pcStack_40)(&local_58,(int *)&local_38,
                    (Cluster<float> *)((long)&pCVar3->cluster_id_ + lVar4));
      uVar5 = uVar5 + 1;
      pCVar3 = (pKVar1->super_StandardKMeans<float>).super_AbstractKMeans<float>.clusters_.
               super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < (ulong)((long)*(pointer *)
                                    ((long)&(pKVar1->super_StandardKMeans<float>).
                                            super_AbstractKMeans<float>.clusters_ + 8) -
                             (long)pCVar3 >> 6));
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void ProductQuantization<DataType, KMeansType>::productJoinClusters() {

    /**
     *  join function for two code book.
     */
    std::function<void (int, const Cluster<DataType>& )> mergeRecursive;

    mergeRecursive = [&] (int codebook_index, const Cluster<DataType>& cluster) {

        if (codebook_index == num_codebook_) {

            tables_.emplace(std::make_pair(cluster.getID(), cluster));
        } else {

            KMeansType& subKMeans = kMeans_[codebook_index];
            for (int i = 0; i < clusterK_; ++i) {
                // joined with the codebook_index'th code book
                Cluster<DataType> mergedCluster = cluster.merge( subKMeans.getClusters()[i], clusterK_ );
                // then joined with the (codebook_index+1)'th code book
                mergeRecursive(codebook_index+1, mergedCluster );
            }
        }
    };

    // start with kMeans[0]
    KMeansType& subKMeans = kMeans_[0];

    for (int i = 0; i < subKMeans.getClusters().size(); ++i) {

        // initialize cluster with al clusters in kMeans[0],
        const Cluster<DataType>& initialCluster =  subKMeans.getClusters()[i];
        // then merge clusters in kMeans[1], then merge cluster in kMeans[2] ....
        mergeRecursive(1, initialCluster );
    }

}